

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressSuperBlock(ZSTD_CCtx *zc,void *dst,size_t dstCapacity,uint lastBlock)

{
  uint uVar1;
  size_t err_code;
  ZSTD_entropyCTablesMetadata_t entropyMetadata;
  uint lastBlock_local;
  size_t dstCapacity_local;
  void *dst_local;
  ZSTD_CCtx *zc_local;
  
  entropyMetadata.fseMetadata.lastCountSize._4_4_ = lastBlock;
  zc_local = (ZSTD_CCtx *)
             ZSTD_buildSuperBlockEntropy
                       (&zc->seqStore,&((zc->blockState).prevCBlock)->entropy,
                        &((zc->blockState).nextCBlock)->entropy,&zc->appliedParams,
                        (ZSTD_entropyCTablesMetadata_t *)&err_code,zc->entropyWorkspace,0x1800);
  uVar1 = ERR_isError((size_t)zc_local);
  if (uVar1 == 0) {
    zc_local = (ZSTD_CCtx *)
               ZSTD_compressSubBlock_multi
                         (&zc->seqStore,&((zc->blockState).nextCBlock)->entropy,
                          (ZSTD_entropyCTablesMetadata_t *)&err_code,&zc->appliedParams,dst,
                          dstCapacity,zc->bmi2,entropyMetadata.fseMetadata.lastCountSize._4_4_,
                          zc->entropyWorkspace,0x1800);
  }
  return (size_t)zc_local;
}

Assistant:

size_t ZSTD_compressSuperBlock(ZSTD_CCtx* zc,
                               void* dst, size_t dstCapacity,
                               unsigned lastBlock) {
    ZSTD_entropyCTablesMetadata_t entropyMetadata;

    FORWARD_IF_ERROR(ZSTD_buildSuperBlockEntropy(&zc->seqStore,
          &zc->blockState.prevCBlock->entropy,
          &zc->blockState.nextCBlock->entropy,
          &zc->appliedParams,
          &entropyMetadata,
          zc->entropyWorkspace, HUF_WORKSPACE_SIZE /* statically allocated in resetCCtx */));

    return ZSTD_compressSubBlock_multi(&zc->seqStore,
            &zc->blockState.nextCBlock->entropy,
            &entropyMetadata,
            &zc->appliedParams,
            dst, dstCapacity,
            zc->bmi2, lastBlock,
            zc->entropyWorkspace, HUF_WORKSPACE_SIZE /* statically allocated in resetCCtx */);
}